

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthCountOnesInCofs0(uint *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  uVar8 = 1 << ((byte)(nVars + -5) & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if ((((0 < nVars) &&
         (uVar8 = (*pTruth >> 2 & 0x11111111) + (*pTruth & 0x11111111),
         uVar8 = (uVar8 >> 4 & 0x3030303) + (uVar8 & 0x3030303),
         uVar8 = (uVar8 >> 8 & 0x70007) + (uVar8 & 0x70007),
         *pStore = (uVar8 >> 0x10) + (uVar8 & 0xffff), nVars != 1)) &&
        (uVar8 = (*pTruth >> 1 & 0x11111111) + (*pTruth & 0x11111111),
        uVar8 = (uVar8 >> 4 & 0x3030303) + (uVar8 & 0x3030303),
        uVar8 = (uVar8 >> 8 & 0x70007) + (uVar8 & 0x70007),
        pStore[1] = (uVar8 >> 0x10) + (uVar8 & 0xffff), 2 < (uint)nVars)) &&
       ((uVar8 = (*pTruth >> 1 & 0x5050505) + (*pTruth & 0x5050505),
        uVar8 = (uVar8 >> 2 & 0x3030303) + (uVar8 & 0x3030303),
        uVar8 = (uVar8 >> 8 & 0x70007) + (uVar8 & 0x70007),
        pStore[2] = (uVar8 >> 0x10) + (uVar8 & 0xffff), nVars != 3 &&
        (uVar8 = (*pTruth >> 1 & 0x550055) + (*pTruth & 0x550055),
        uVar8 = (uVar8 >> 2 & 0x330033) + (uVar8 & 0x330033),
        uVar8 = (uVar8 >> 4 & 0x70007) + (uVar8 & 0x70007),
        pStore[3] = (uVar8 >> 0x10) + (uVar8 & 0xffff), nVars == 5)))) {
      uVar8 = (*pTruth >> 1 & 0x5555) + (*pTruth & 0x5555);
      uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333);
      uVar8 = (uVar8 >> 4 & 0x707) + (uVar8 & 0x707);
      pStore[4] = (uVar8 >> 8) + (uVar8 & 0xff);
    }
  }
  else if (nVars + -5 != 0x1f) {
    uVar1 = 0;
    do {
      uVar3 = (pTruth[uVar1] >> 1 & 0x55555555) + (pTruth[uVar1] & 0x55555555);
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
      uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
      uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
      lVar6 = 0;
      do {
        if (((uint)uVar1 >> ((uint)lVar6 & 0x1f) & 1) == 0) {
          pStore[lVar6 + 5] = pStore[lVar6 + 5] + (uVar3 >> 0x10) + (uVar3 & 0xffff);
        }
        lVar6 = lVar6 + 1;
      } while ((ulong)(uint)nVars - 5 != lVar6);
      uVar1 = uVar1 + 1;
    } while (uVar1 != uVar8);
    if (1 < (int)uVar8) {
      iVar7 = *pStore;
      iVar4 = pStore[1];
      iVar5 = pStore[2];
      iVar2 = pStore[3];
      iVar9 = pStore[4];
      lVar6 = 0;
      do {
        uVar3 = (pTruth[lVar6 * 2 + 1] & 0x55555555) + (pTruth[lVar6 * 2] & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar7 = (uVar3 >> 0x10) + iVar7 + (uVar3 & 0xff);
        *pStore = iVar7;
        uVar3 = (pTruth[lVar6 * 2] & 0x33333333) + (pTruth[lVar6 * 2 + 1] & 0xf3333333) * 4;
        uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar4 = (uVar3 >> 0x10) + iVar4 + (uVar3 & 0xff);
        pStore[1] = iVar4;
        uVar3 = (pTruth[lVar6 * 2 + 1] & 0xf0f0f0f) << 4 | pTruth[lVar6 * 2] & 0xf0f0f0f;
        uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar5 = (uVar3 >> 0x10) + iVar5 + (uVar3 & 0xff);
        pStore[2] = iVar5;
        uVar3 = (pTruth[lVar6 * 2 + 1] & 0xff00ff) << 8 | pTruth[lVar6 * 2] & 0xff00ff;
        uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar2 = (uVar3 >> 0x10) + iVar2 + (uVar3 & 0xff);
        pStore[3] = iVar2;
        uVar3 = pTruth[lVar6 * 2 + 1] << 0x10 | (uint)(ushort)pTruth[lVar6 * 2];
        uVar3 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar9 = (uVar3 >> 0x10) + iVar9 + (uVar3 & 0xff);
        pStore[4] = iVar9;
        lVar6 = lVar6 + 1;
      } while ((int)uVar8 / 2 != (int)lVar6);
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs0( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
            pStore[0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
        if ( nVars > 1 )
            pStore[1] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
        if ( nVars > 2 )
            pStore[2] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
        if ( nVars > 3 )
            pStore[3] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
        if ( nVars > 4 )
            pStore[4] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( (k & (1 << (i-5))) == 0 )
                pStore[i] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[1] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[3] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[4] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pTruth += 2;
    }
}